

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void fail_if_blocks_allocated(ListNode *check_point,char *test_name)

{
  ListNode *pLVar1;
  long lVar2;
  undefined8 *puVar3;
  void **ppvVar4;
  ListNode *pLVar5;
  int quit_application;
  long lVar6;
  long *in_FS_OFFSET;
  bool bVar7;
  
  lVar2 = *in_FS_OFFSET;
  pLVar1 = (ListNode *)(lVar2 + -0x38);
  if (pLVar1->value == (void *)0x0) {
    *(ListNode **)(lVar2 + -0x28) = pLVar1;
    *(ListNode **)(lVar2 + -0x20) = pLVar1;
    *(undefined4 *)(lVar2 + -0x30) = 1;
    pLVar1->value = (void *)0x1;
  }
  if (check_point == (ListNode *)0x0) {
    cm_print_error("%s\n","check_point");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x851);
  }
  pLVar5 = check_point->next;
  if (pLVar5 == (ListNode *)0x0) {
    cm_print_error("%s\n","check_point->next");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x852);
  }
  if (pLVar5 != pLVar1) {
    lVar6 = 0;
    do {
      puVar3 = (undefined8 *)pLVar5->value;
      if (puVar3 == (undefined8 *)0x0) {
        cm_print_error("%s\n","block_info.ptr");
        _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
              ,0x858);
      }
      bVar7 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (bVar7) {
        cm_print_error("Blocks allocated...\n");
      }
      cm_print_error("%s:%u: note: block %p allocated here\n",puVar3[3],(ulong)*(uint *)(puVar3 + 4)
                     ,*puVar3);
      pLVar5 = pLVar5->next;
    } while (pLVar5 != pLVar1);
    if (lVar6 != 0) {
      if (pLVar1->value == (void *)0x0) {
        *(ListNode **)(lVar2 + -0x28) = pLVar1;
        *(ListNode **)(lVar2 + -0x20) = pLVar1;
        *(undefined4 *)(lVar2 + -0x30) = 1;
        pLVar1->value = (void *)0x1;
      }
      pLVar5 = check_point->next;
      if (pLVar5 == (ListNode *)0x0) {
        cm_print_error("%s\n","node");
        _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
              ,0x86e);
      }
      while (pLVar5 != pLVar1) {
        ppvVar4 = &pLVar5->value;
        pLVar5 = pLVar5->next;
        _test_free((void *)((long)*ppvVar4 + 0x58),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
                   ,0x877);
      }
      quit_application = 0x12d5bc;
      cm_print_error("ERROR: %s leaked %zu block(s)\n",test_name,-lVar6);
      exit_test(quit_application);
    }
  }
  return;
}

Assistant:

static void fail_if_blocks_allocated(const ListNode * const check_point,
                                     const char * const test_name) {
    const size_t allocated_blocks = display_allocated_blocks(check_point);
    if (allocated_blocks > 0) {
        free_allocated_blocks(check_point);
        cm_print_error("ERROR: %s leaked %zu block(s)\n", test_name,
                       allocated_blocks);
        exit_test(1);
    }
}